

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

string * CoreML::Specification::TreeEnsembleParameters_TreeNode_TreeNodeBehavior_Name_abi_cxx11_
                   (TreeEnsembleParameters_TreeNode_TreeNodeBehavior value)

{
  int iVar1;
  string *psVar2;
  
  if (TreeEnsembleParameters_TreeNode_TreeNodeBehavior_Name[abi:cxx11](CoreML::Specification::TreeEnsembleParameters_TreeNode_TreeNodeBehavior)
      ::dummy == '\0') {
    iVar1 = __cxa_guard_acquire(&TreeEnsembleParameters_TreeNode_TreeNodeBehavior_Name[abi:cxx11](CoreML::Specification::TreeEnsembleParameters_TreeNode_TreeNodeBehavior)
                                 ::dummy);
    if (iVar1 != 0) {
      TreeEnsembleParameters_TreeNode_TreeNodeBehavior_Name::dummy =
           google::protobuf::internal::InitializeEnumStrings
                     ((EnumEntry *)TreeEnsembleParameters_TreeNode_TreeNodeBehavior_entries,
                      (int *)TreeEnsembleParameters_TreeNode_TreeNodeBehavior_entries_by_number,7,
                      (ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)TreeEnsembleParameters_TreeNode_TreeNodeBehavior_strings_abi_cxx11_);
      __cxa_guard_release(&TreeEnsembleParameters_TreeNode_TreeNodeBehavior_Name[abi:cxx11](CoreML::Specification::TreeEnsembleParameters_TreeNode_TreeNodeBehavior)
                           ::dummy);
    }
  }
  iVar1 = google::protobuf::internal::LookUpEnumName
                    ((EnumEntry *)TreeEnsembleParameters_TreeNode_TreeNodeBehavior_entries,
                     (int *)TreeEnsembleParameters_TreeNode_TreeNodeBehavior_entries_by_number,7,
                     value);
  if (iVar1 == -1) {
    psVar2 = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
      google::protobuf::internal::InitProtobufDefaultsSlow();
    }
  }
  else {
    psVar2 = (string *)
             (TreeEnsembleParameters_TreeNode_TreeNodeBehavior_strings_abi_cxx11_ +
             (long)iVar1 * 0x20);
  }
  return psVar2;
}

Assistant:

const std::string& TreeEnsembleParameters_TreeNode_TreeNodeBehavior_Name(
    TreeEnsembleParameters_TreeNode_TreeNodeBehavior value) {
  static const bool dummy =
      ::PROTOBUF_NAMESPACE_ID::internal::InitializeEnumStrings(
          TreeEnsembleParameters_TreeNode_TreeNodeBehavior_entries,
          TreeEnsembleParameters_TreeNode_TreeNodeBehavior_entries_by_number,
          7, TreeEnsembleParameters_TreeNode_TreeNodeBehavior_strings);
  (void) dummy;
  int idx = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumName(
      TreeEnsembleParameters_TreeNode_TreeNodeBehavior_entries,
      TreeEnsembleParameters_TreeNode_TreeNodeBehavior_entries_by_number,
      7, value);
  return idx == -1 ? ::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString() :
                     TreeEnsembleParameters_TreeNode_TreeNodeBehavior_strings[idx].get();
}